

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_wallmarks.cxx
# Opt level: O0

void __thiscall xray_re::xr_scene_wallmarks::load(xr_scene_wallmarks *this,xr_reader *r)

{
  xr_scene_revision *this_00;
  size_t sVar1;
  float fVar2;
  xr_reader *local_28;
  xr_reader *s;
  xr_reader *pxStack_18;
  uint16_t version;
  xr_reader *r_local;
  xr_scene_wallmarks *this_local;
  
  pxStack_18 = r;
  r_local = (xr_reader *)this;
  this_00 = xr_scene_part::revision(&this->super_xr_scene_part);
  xr_scene_revision::load(this_00,pxStack_18);
  sVar1 = xr_reader::r_chunk<unsigned_short>(pxStack_18,1,(unsigned_short *)((long)&s + 6));
  if (sVar1 == 0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                  ,0x34,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
  }
  if (s._6_2_ != 3) {
    __assert_fail("version == WALLMARK_VERSION",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                  ,0x35,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
  }
  sVar1 = xr_reader::find_chunk(pxStack_18,3);
  if (sVar1 != 0) {
    fVar2 = xr_reader::r_float(pxStack_18);
    this->m_width = fVar2;
    fVar2 = xr_reader::r_float(pxStack_18);
    this->m_height = fVar2;
    fVar2 = xr_reader::r_float(pxStack_18);
    this->m_rotate = fVar2;
    xr_reader::r_sz(pxStack_18,&this->m_shader);
    xr_reader::r_sz(pxStack_18,&this->m_texture);
    xr_reader::debug_find_chunk(pxStack_18);
    local_28 = xr_reader::open_chunk(pxStack_18,5);
    if (local_28 == (xr_reader *)0x0) {
      local_28 = xr_reader::open_chunk(pxStack_18,4);
      if (local_28 != (xr_reader *)0x0) {
        xr_reader::
        r_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,read_slot_0>
                  (local_28,&this->m_slots);
        xr_reader::close_chunk(pxStack_18,&local_28);
      }
    }
    else {
      xr_reader::
      r_chunks<std::vector<xray_re::wm_slot_le*,std::allocator<xray_re::wm_slot_le*>>,read_slot_1>
                (local_28,&this->m_slots);
      xr_reader::close_chunk(pxStack_18,&local_28);
    }
    return;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_scene_wallmarks.cxx"
                ,0x38,"virtual void xray_re::xr_scene_wallmarks::load(xr_reader &)");
}

Assistant:

void xr_scene_wallmarks::load(xr_reader& r)
{
	revision().load(r);

	uint16_t version;
	if (!r.r_chunk<uint16_t>(WM_CHUNK_VERSION, version))
		xr_not_expected();
	xr_assert(version == WALLMARK_VERSION);

	if (!r.find_chunk(WM_CHUNK_PARAMS))
		xr_not_expected();
	m_width = r.r_float();
	m_height = r.r_float();
	m_rotate = r.r_float();
	r.r_sz(m_shader);
	r.r_sz(m_texture);
	r.debug_find_chunk();

	xr_reader* s;
	if ((s = r.open_chunk(WM_CHUNK_WALLMARKS_1))) {
		s->r_chunks(m_slots, read_slot_1());
		r.close_chunk(s);
	} else if ((s = r.open_chunk(WM_CHUNK_WALLMARKS_0))) {
		s->r_chunks(m_slots, read_slot_0());
		r.close_chunk(s);
	}
}